

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_compute_pipeline
          (Impl *this,Hash hash,VkComputePipelineCreateInfo *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  pointer __dest;
  bool bVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Ch *__src;
  Value value;
  Value serialized_compute_pipelines;
  Data local_128;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_118;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_110;
  Stack<rapidjson::CrtAllocator> local_108;
  undefined4 local_d8;
  undefined8 local_d0;
  Data local_c8;
  undefined1 local_b8 [16];
  CrtAllocator *pCStack_a8;
  char *local_a0;
  char *pcStack_98;
  char *local_90;
  size_t local_88;
  int local_80;
  bool local_7c;
  Data local_78;
  CrtAllocator *local_68;
  CrtAllocator *pCStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  size_t local_40;
  
  local_108.stack_ = (char *)0x0;
  local_108.stackTop_ = (char *)0x0;
  local_108.allocator_ = (CrtAllocator *)0x0;
  local_108.ownAllocator_ = (CrtAllocator *)0x0;
  local_118 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_110 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_128.n = (Number)0x0;
  local_128.s.str = (Ch *)0x0;
  local_108.stackEnd_ = (char *)0x0;
  local_108.initialCapacity_ = 0x400;
  local_d8 = 0;
  local_d0 = 0;
  alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  alloc->chunkHead_ = (ChunkHeader *)0x0;
  alloc->chunk_capacity_ = 0x10000;
  alloc->userBuffer_ = (void *)0x0;
  alloc->baseAllocator_ = (CrtAllocator *)0x0;
  alloc->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_128.n = (Number)0x0;
  local_128.s.str = (Ch *)0x3000000000000;
  local_c8.n = (Number)0x0;
  local_c8.s.str = (Ch *)0x0;
  local_118 = alloc;
  pMStack_110 = alloc;
  bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (create_info,alloc,(Value *)&local_c8.s);
  if (bVar1) {
    local_78.n.i64 = (Number)0x0;
    local_78.s.str = (Ch *)0x3000000000000;
    uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Fossilize *)local_b8,hash,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_b8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,alloc);
    pCStack_60 = (CrtAllocator *)0x4050000003cd1ad;
    local_68 = (CrtAllocator *)0x7;
    local_b8._0_8_ = (Number)0x6;
    local_b8._8_8_ = (Ch *)0x1f6000000000000;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_128.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_68,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_b8,alloc);
    local_b8._8_8_ = (Ch *)0x4050000003b4ffb;
    local_b8._0_8_ = (Number)0x10;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_128.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_b8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_78.s,alloc);
    local_48 = (char *)0x0;
    local_58 = (char *)0x0;
    pcStack_50 = (char *)0x0;
    local_68 = (CrtAllocator *)0x0;
    pCStack_60 = (CrtAllocator *)0x0;
    local_40 = 0x100;
    local_b8._8_8_ = (Ch *)0x0;
    pCStack_a8 = (CrtAllocator *)0x0;
    local_a0 = (char *)0x0;
    pcStack_98 = (char *)0x0;
    local_90 = (char *)0x0;
    local_88 = 0x200;
    local_80 = 0x144;
    local_7c = false;
    local_b8._0_8_ = &local_68;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_128.s,
               (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)local_b8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (blob,(long)pcStack_50 - (long)local_58);
    __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            GetString((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &local_68);
    memcpy(__dest,__src,(long)pcStack_50 - (long)local_58);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
              ((Stack<rapidjson::CrtAllocator> *)(local_b8 + 8));
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
              ((Stack<rapidjson::CrtAllocator> *)&local_68);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_128.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_108);
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::serialize_compute_pipeline(Hash hash, const VkComputePipelineCreateInfo &create_info, vector<uint8_t> &blob) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value value;
	if (!json_value(create_info, alloc, &value))
		return false;

	Value serialized_compute_pipelines(kObjectType);
	serialized_compute_pipelines.AddMember(uint64_string(hash, alloc), value, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("computePipelines", serialized_compute_pipelines, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize());
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	return true;
}